

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O1

void ovf::detail::parse::ovf_file_action<ovf::detail::parse::version_number>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,char_const*>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>_>
                *in,ovf_file *file)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,(in->m_begin).data,
             (in->m_input->
             super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
             ).m_current.data);
  __nptr = local_58[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    file->version = (int)lVar3;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    return;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

static void apply( const Input& in, ovf_file & file )
        {
            file.version = std::stoi(in.string());
        }